

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

void handle_pp_undef(Context_conflict1 *ctx)

{
  uint uVar1;
  IncludeState *s;
  long lVar2;
  byte bVar3;
  Token TVar4;
  int iVar5;
  byte *pbVar6;
  Define *pDVar7;
  byte bVar8;
  char *pcVar9;
  Define **ppDVar10;
  ulong uVar11;
  byte *__s1;
  Define *pDVar12;
  undefined8 uStack_40;
  byte abStack_38 [8];
  
  s = ctx->include_stack;
  if (s->pushedback == 0) {
    uStack_40 = 0x12fd53;
    TVar4 = preprocessor_lexer(s);
  }
  else {
    s->pushedback = 0;
    TVar4 = s->tokenval;
  }
  if (TVar4 != TOKEN_IDENTIFIER) {
    pcVar9 = "Macro names must be indentifiers";
LAB_0012fdef:
    failf(ctx,"%s",pcVar9);
    return;
  }
  uVar1 = s->tokenlen;
  lVar2 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
  __s1 = abStack_38 + lVar2;
  pcVar9 = s->token;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fd83;
  memcpy(__s1,pcVar9,(ulong)uVar1);
  __s1[uVar1] = 0;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fd90;
  iVar5 = require_newline(s);
  if (iVar5 == 0) {
    pcVar9 = "Invalid #undef directive";
    goto LAB_0012fdef;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fda3;
  iVar5 = strcmp((char *)__s1,"__FILE__");
  if (iVar5 == 0) {
    if (ctx->file_macro == (Define *)0x0) goto LAB_0012fe3e;
    ppDVar10 = &ctx->file_macro;
  }
  else {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fdb6;
    iVar5 = strcmp((char *)__s1,"__LINE__");
    if ((iVar5 != 0) || (ctx->line_macro == (Define *)0x0)) goto LAB_0012fe3e;
    ppDVar10 = &ctx->line_macro;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fe2c;
  failf(ctx,"undefining \"%s\"",__s1);
  pDVar12 = *ppDVar10;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fe37;
  free_define(ctx,pDVar12);
  *ppDVar10 = (Define *)0x0;
LAB_0012fe3e:
  bVar3 = *__s1;
  if (bVar3 == 0) {
    uVar11 = 5;
  }
  else {
    pbVar6 = abStack_38 + lVar2 + 1;
    bVar8 = 5;
    do {
      bVar8 = bVar8 * '!' ^ bVar3;
      bVar3 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar3 != 0);
    uVar11 = (ulong)bVar8;
  }
  pDVar12 = ctx->define_hashtable[uVar11];
  if (pDVar12 != (Define *)0x0) {
    pcVar9 = pDVar12->identifier;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fe84;
    iVar5 = strcmp(pcVar9,(char *)__s1);
    if (iVar5 == 0) {
      pDVar7 = (Define *)0x0;
    }
    else {
      do {
        pDVar7 = pDVar12;
        pDVar12 = pDVar7->next;
        if (pDVar12 == (Define *)0x0) {
          return;
        }
        pcVar9 = pDVar12->identifier;
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fe9f;
        iVar5 = strcmp(pcVar9,(char *)__s1);
      } while (iVar5 != 0);
    }
    ppDVar10 = &pDVar7->next;
    if (pDVar7 == (Define *)0x0) {
      ppDVar10 = ctx->define_hashtable + uVar11;
    }
    *ppDVar10 = pDVar12->next;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x12fed4;
    free_define(ctx,pDVar12);
  }
  return;
}

Assistant:

static void handle_pp_undef(Context *ctx)
{
    IncludeState *state = ctx->include_stack;

    if (lexer(state) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Macro names must be indentifiers");
        return;
    } // if

    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    if (!require_newline(state))
    {
        fail(ctx, "Invalid #undef directive");
        return;
    } // if

    if (strcmp(sym, "__FILE__") == 0)
    {
        if (ctx->file_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->file_macro);
            ctx->file_macro = NULL;
        } // if
    } // if
    else if (strcmp(sym, "__LINE__") == 0)
    {
        if (ctx->line_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->line_macro);
            ctx->line_macro = NULL;
        } // if
    } // if

    remove_define(ctx, sym);
}